

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

uint MurmurHash2(void *key,size_t len)

{
  uint uVar1;
  byte *pbStack_30;
  uint k;
  uchar *data;
  uint h;
  int r;
  uint m;
  size_t len_local;
  void *key_local;
  
  data._4_4_ = (uint)len ^ 0xdecafbad;
  pbStack_30 = (byte *)key;
  for (_r = len; 3 < _r; _r = _r - 4) {
    data._4_4_ = ((uint)(*(int *)pbStack_30 * 0x5bd1e995) >> 0x18 ^ *(int *)pbStack_30 * 0x5bd1e995)
                 * 0x5bd1e995 ^ data._4_4_ * 0x5bd1e995;
    pbStack_30 = pbStack_30 + 4;
  }
  if (_r != 1) {
    if (_r != 2) {
      if (_r != 3) goto LAB_0013e1d1;
      data._4_4_ = (uint)pbStack_30[2] << 0x10 ^ data._4_4_;
    }
    data._4_4_ = (uint)pbStack_30[1] << 8 ^ data._4_4_;
  }
  data._4_4_ = (*pbStack_30 ^ data._4_4_) * 0x5bd1e995;
LAB_0013e1d1:
  uVar1 = (data._4_4_ >> 0xd ^ data._4_4_) * 0x5bd1e995;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

static inline
unsigned int MurmurHash2(const void* key, size_t len) {
  static const unsigned int seed = 0xDECAFBAD;
  const unsigned int m = 0x5bd1e995;
  const int r = 24;
  unsigned int h = seed ^ len;
  const unsigned char* data = (const unsigned char*)key;
  while (len >= 4) {
    unsigned int k;
    memcpy(&k, data, sizeof k);
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
    data += 4;
    len -= 4;
  }
  switch (len) {
  case 3: h ^= data[2] << 16;
          NINJA_FALLTHROUGH;
  case 2: h ^= data[1] << 8;
          NINJA_FALLTHROUGH;
  case 1: h ^= data[0];
    h *= m;
  };
  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}